

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5WriteFlushBtree(Fts5Index *p,Fts5SegWriter *pWriter)

{
  Fts5DlidxWriter *pFVar1;
  int iVar2;
  u8 *zData;
  int i;
  long lVar3;
  long lVar4;
  long lVar5;
  uint local_34;
  
  if (pWriter->iBtPage != 0) {
    if ((pWriter->aDlidx->buf).n < 1) {
      local_34 = 0;
    }
    else {
      local_34 = (uint)(3 < pWriter->nEmpty);
    }
    lVar4 = 0x1000000000;
    lVar5 = 0x18;
    for (lVar3 = 0; lVar3 < pWriter->nDlidx; lVar3 = lVar3 + 1) {
      pFVar1 = pWriter->aDlidx;
      iVar2 = *(int *)((long)&pFVar1->pgno + lVar5);
      if (iVar2 == 0) break;
      if (local_34 != 0) {
        fts5DataWrite(p,((ulong)(uint)pWriter->iSegid << 0x25) + lVar4 +
                        (long)*(int *)((long)pFVar1 + lVar5 + -0x18),
                      *(u8 **)((long)pFVar1 + lVar5 + -8),iVar2);
      }
      *(undefined4 *)((long)&pFVar1->pgno + lVar5) = 0;
      *(undefined4 *)((long)pFVar1 + lVar5 + -0x14) = 0;
      lVar4 = lVar4 + 0x80000000;
      lVar5 = lVar5 + 0x20;
    }
    pWriter->nEmpty = 0;
    if (p->rc == 0) {
      iVar2 = (pWriter->btterm).n;
      if (iVar2 < 1) {
        zData = "";
      }
      else {
        zData = (pWriter->btterm).p;
      }
      sqlite3_bind_blob(p->pIdxWriter,2,zData,iVar2,(_func_void_void_ptr *)0x0);
      sqlite3_bind_int64(p->pIdxWriter,3,(ulong)local_34 + (long)pWriter->iBtPage * 2);
      sqlite3_step(p->pIdxWriter);
      iVar2 = sqlite3_reset(p->pIdxWriter);
      p->rc = iVar2;
      sqlite3_bind_null(p->pIdxWriter,2);
    }
    pWriter->iBtPage = 0;
  }
  return;
}

Assistant:

static void fts5WriteFlushBtree(Fts5Index *p, Fts5SegWriter *pWriter){
  int bFlag;

  assert( pWriter->iBtPage || pWriter->nEmpty==0 );
  if( pWriter->iBtPage==0 ) return;
  bFlag = fts5WriteFlushDlidx(p, pWriter);

  if( p->rc==SQLITE_OK ){
    const char *z = (pWriter->btterm.n>0?(const char*)pWriter->btterm.p:"");
    /* The following was already done in fts5WriteInit(): */
    /* sqlite3_bind_int(p->pIdxWriter, 1, pWriter->iSegid); */
    sqlite3_bind_blob(p->pIdxWriter, 2, z, pWriter->btterm.n, SQLITE_STATIC);
    sqlite3_bind_int64(p->pIdxWriter, 3, bFlag + ((i64)pWriter->iBtPage<<1));
    sqlite3_step(p->pIdxWriter);
    p->rc = sqlite3_reset(p->pIdxWriter);
    sqlite3_bind_null(p->pIdxWriter, 2);
  }
  pWriter->iBtPage = 0;
}